

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

waiter * nsync_waiter_new_(void)

{
  waiter *pwVar1;
  nsync_dll_element_ *e;
  long *in_FS_OFFSET;
  waiter *local_20;
  waiter *w;
  waiter *tw;
  nsync_dll_element_ *q;
  
  pwVar1 = *(waiter **)(*in_FS_OFFSET + -8);
  if ((pwVar1 == (waiter *)0x0) || (local_20 = pwVar1, (pwVar1->flags & 3U) != 1)) {
    local_20 = (waiter *)0x0;
    nsync_spin_test_and_set_(&free_waiters_mu,1,1,0);
    e = nsync_dll_first_(free_waiters);
    if (e != (nsync_dll_element_ *)0x0) {
      free_waiters = nsync_dll_remove_(free_waiters,e);
      local_20 = (waiter *)((long)e->container + -0x108);
    }
    free_waiters_mu = 0;
    if (local_20 == (waiter *)0x0) {
      if (nsync_malloc_ptr_ == (_func_void_ptr_size_t *)0x0) {
        local_20 = (waiter *)malloc(400);
      }
      else {
        local_20 = (waiter *)(*nsync_malloc_ptr_)(400);
      }
      local_20->tag = 0x590239f;
      (local_20->nw).tag = 0x726d2ba9;
      nsync_mu_semaphore_init(&local_20->sem);
      (local_20->nw).sem = &local_20->sem;
      nsync_dll_init_(&(local_20->nw).q,&local_20->nw);
      (local_20->nw).waiting = 0;
      (local_20->nw).flags = 1;
      local_20->remove_count = 0;
      nsync_dll_init_(&local_20->same_condition,local_20);
      local_20->flags = 0;
    }
    if (pwVar1 == (waiter *)0x0) {
      local_20->flags = local_20->flags | 1;
      nsync_set_per_thread_waiter_(local_20,waiter_destroy);
      *(waiter **)(*in_FS_OFFSET + -8) = local_20;
    }
  }
  local_20->flags = local_20->flags | 2;
  return local_20;
}

Assistant:

waiter *nsync_waiter_new_ (void) {
	nsync_dll_element_ *q;
	waiter *tw;
	waiter *w;
	if (HAVE_THREAD_LOCAL) {
		tw = waiter_for_thread;
	} else {
		tw = (waiter *) nsync_per_thread_waiter_ (&waiter_destroy);
	}
	w = tw;
	if (w == NULL || (w->flags & (WAITER_RESERVED|WAITER_IN_USE)) != WAITER_RESERVED) {
		w = NULL;
		nsync_spin_test_and_set_ (&free_waiters_mu, 1, 1, 0);
		q = nsync_dll_first_ (free_waiters);
		if (q != NULL) { /* If free list is non-empty, dequeue an item. */
			free_waiters = nsync_dll_remove_ (free_waiters, q);
			w = DLL_WAITER (q);
		}
		ATM_STORE_REL (&free_waiters_mu, 0); /* release store */
		if (w == NULL) { /* If free list was empty, allocate an item. */
			if (nsync_malloc_ptr_ != NULL) { /* Use client's malloc() */
				w = (waiter *) (*nsync_malloc_ptr_) (sizeof (*w));
			} else {  /* standard malloc () */
				w = (waiter *) malloc (sizeof (*w));
			}
			w->tag = WAITER_TAG;
			w->nw.tag = NSYNC_WAITER_TAG;
			nsync_mu_semaphore_init (&w->sem);
			w->nw.sem = &w->sem;
			nsync_dll_init_ (&w->nw.q, &w->nw);
			NSYNC_ATOMIC_UINT32_STORE_ (&w->nw.waiting, 0);
			w->nw.flags = NSYNC_WAITER_FLAG_MUCV;
			ATM_STORE (&w->remove_count, 0);
			nsync_dll_init_ (&w->same_condition, w);
			w->flags = 0;
		}
		if (tw == NULL) {
			w->flags |= WAITER_RESERVED;
			nsync_set_per_thread_waiter_ (w, &waiter_destroy);
			if (HAVE_THREAD_LOCAL) {
				waiter_for_thread = w;
			}
		}
	}
	w->flags |= WAITER_IN_USE;
	return (w);
}